

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O2

SatType __thiscall features::Surf::filter_dxy(Surf *this,int fs,int x,int y)

{
  int iVar1;
  element_type *peVar2;
  pointer plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  peVar2 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar4 = (peVar2->super_TypedImageBase<long>).super_ImageBase.w;
  iVar8 = (~fs + y) * iVar4 + x + ~fs;
  iVar1 = iVar8 + iVar4 * fs;
  plVar3 = (peVar2->super_TypedImageBase<long>).data.super__Vector_base<long,_std::allocator<long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar9 = iVar8 + fs;
  iVar10 = iVar1 + fs;
  iVar5 = iVar4 + iVar1;
  iVar4 = iVar4 * fs + iVar5;
  iVar6 = iVar5 + fs;
  iVar7 = iVar4 + fs;
  return ((((((plVar3[iVar8] + plVar3[iVar10]) -
             (plVar3[iVar9] + plVar3[iVar1] + plVar3[(long)iVar9 + 1])) +
             plVar3[(long)(iVar9 + fs) + 1] + plVar3[(long)iVar10 + 1]) -
           (plVar3[(long)(iVar10 + fs) + 1] + plVar3[iVar5])) + plVar3[iVar6] + plVar3[iVar4] +
          plVar3[(long)iVar6 + 1]) -
         (plVar3[iVar7] + plVar3[(long)(iVar6 + fs) + 1] + plVar3[(long)iVar7 + 1])) +
         plVar3[(long)(fs + iVar7) + 1];
}

Assistant:

Surf::SatType
Surf::filter_dxy (int fs, int x, int y)
{
    int const w = this->sat->width();
    int const row1 = (x - fs - 1) + w * (y - fs - 1);
    int const row2 = row1 + w * fs;
    int const row3 = row2 + w;
    int const row4 = row3 + w * fs;

    Surf::SatType ret = 0;
    Surf::SatType v0 = this->sat->at(row1);
    Surf::SatType v1 = this->sat->at(row1 + fs);
    Surf::SatType v2 = this->sat->at(row2);
    Surf::SatType v3 = this->sat->at(row2 + fs);
    ret += v3 + v0 - v2 - v1;

    v0 = this->sat->at(row1 + fs + 1);
    v1 = this->sat->at(row1 + fs + fs + 1);
    v2 = this->sat->at(row2 + fs + 1);
    v3 = this->sat->at(row2 + fs + fs + 1);
    ret -= v3 + v0 - v2 - v1;

    v0 = this->sat->at(row3);
    v1 = this->sat->at(row3 + fs);
    v2 = this->sat->at(row4);
    v3 = this->sat->at(row4 + fs);
    ret -= v3 + v0 - v2 - v1;

    v0 = this->sat->at(row3 + fs + 1);
    v1 = this->sat->at(row3 + fs + fs + 1);
    v2 = this->sat->at(row4 + fs + 1);
    v3 = this->sat->at(row4 + fs + fs + 1);
    ret += v3 + v0 - v2 - v1;

    return ret;
}